

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDiscreteAccessory,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcDiscreteAccessory *in;
  
  in = (IfcDiscreteAccessory *)operator_new(0x170);
  *(undefined ***)&(in->super_IfcElementComponent).field_0x158 = &PTR__Object_008a0070;
  *(undefined8 *)&in->field_0x160 = 0;
  *(char **)&in->field_0x168 = "IfcDiscreteAccessory";
  Assimp::IFC::Schema_2x3::IfcElementComponent::IfcElementComponent
            ((IfcElementComponent *)in,&PTR_construction_vtable_24__0093c488);
  *(undefined ***)&(in->super_IfcElementComponent).super_IfcElement.super_IfcProduct.super_IfcObject
       = &PTR__IfcDiscreteAccessory_0093c358;
  *(undefined ***)&(in->super_IfcElementComponent).field_0x158 = &PTR__IfcDiscreteAccessory_0093c470
  ;
  *(undefined ***)
   &(in->super_IfcElementComponent).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       &PTR__IfcDiscreteAccessory_0093c380;
  (in->super_IfcElementComponent).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcDiscreteAccessory_0093c3a8;
  *(undefined ***)
   &(in->super_IfcElementComponent).super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       &PTR__IfcDiscreteAccessory_0093c3d0;
  *(undefined ***)&(in->super_IfcElementComponent).super_IfcElement.super_IfcProduct.field_0x100 =
       &PTR__IfcDiscreteAccessory_0093c3f8;
  *(undefined ***)&(in->super_IfcElementComponent).super_IfcElement.field_0x138 =
       &PTR__IfcDiscreteAccessory_0093c420;
  *(undefined ***)&(in->super_IfcElementComponent).super_IfcElement.field_0x148 =
       &PTR__IfcDiscreteAccessory_0093c448;
  GenericFill<Assimp::IFC::Schema_2x3::IfcDiscreteAccessory>(db,params,in);
  return (Object *)
         (&(in->super_IfcElementComponent).super_IfcElement.super_IfcProduct.super_IfcObject.
           field_0x0 +
         *(long *)(*(long *)&(in->super_IfcElementComponent).super_IfcElement.super_IfcProduct.
                             super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }